

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcCube.c
# Opt level: O1

void Mvc_CubeFree(Mvc_Cover_t *pCover,Mvc_Cube_t *pCube)

{
  uint uVar1;
  Extra_MmFixed_t *p;
  
  if (pCube == (Mvc_Cube_t *)0x0) {
    return;
  }
  uVar1 = *(uint *)&pCube->field_0x8 & 0xffffff;
  if ((uVar1 != 0) && (uVar1 != pCover->nWords - 1U)) {
    __assert_fail("pCube->iLast == 0 || ((int)pCube->iLast) == pCover->nWords - 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/mvc/mvcCube.c"
                  ,0x78,"void Mvc_CubeFree(Mvc_Cover_t *, Mvc_Cube_t *)");
  }
  if ((*(uint *)&pCube->field_0x8 >> 0x18 & 0x3f) != pCover->nUnused) {
    __assert_fail("((int)pCube->nUnused) == pCover->nUnused",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/mvc/mvcCube.c"
                  ,0x79,"void Mvc_CubeFree(Mvc_Cover_t *, Mvc_Cube_t *)");
  }
  uVar1 = pCover->nWords;
  if (uVar1 < 2) {
    p = pCover->pMem->pMan1;
  }
  else if (uVar1 - 3 < 2) {
    p = pCover->pMem->pMan4;
  }
  else {
    if (uVar1 != 2) {
      free(pCube);
      return;
    }
    p = pCover->pMem->pMan2;
  }
  Extra_MmFixedEntryRecycle(p,(char *)pCube);
  return;
}

Assistant:

void Mvc_CubeFree( Mvc_Cover_t * pCover, Mvc_Cube_t * pCube )
{
    if ( pCube == NULL )
        return;

    // verify the parameters charactering this cube
    assert( pCube->iLast == 0 || ((int)pCube->iLast) == pCover->nWords - 1 );
    assert( ((int)pCube->nUnused) == pCover->nUnused );

    // deallocate the cube
#ifdef USE_SYSTEM_MEMORY_MANAGEMENT
    ABC_FREE( pCube );
#else
    switch( pCover->nWords )
    {
    case 0:
    case 1:
        Extra_MmFixedEntryRecycle( pCover->pMem->pMan1, (char *)pCube );
        break;
    case 2:
        Extra_MmFixedEntryRecycle( pCover->pMem->pMan2, (char *)pCube );
        break;
    case 3:
    case 4:
        Extra_MmFixedEntryRecycle( pCover->pMem->pMan4, (char *)pCube );
        break;
    default:
        ABC_FREE( pCube );
        break;
    }
#endif
}